

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O1

void deqp::gls::InteractionTestUtil::computeRandomRenderState
               (Random *rnd,RenderState *state,ApiType apiType,int targetWidth,int targetHeight)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  long lVar6;
  deUint32 *last;
  int iVar7;
  int ndx;
  deUint32 *first;
  float fVar8;
  uint val;
  uint local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  deUint32 local_48;
  int local_44;
  int local_40;
  deUint32 local_3c;
  RenderState *local_38;
  
  local_3c = apiType.m_bits;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->scissorTestEnabled = fVar8 < 0.2;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->stencilTestEnabled = fVar8 < 0.4;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->depthTestEnabled = fVar8 < 0.6;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->blendEnabled = fVar8 < 0.4;
  fVar8 = deRandom_getFloat(&rnd->m_rnd);
  state->ditherEnabled = fVar8 < 0.5;
  if (state->scissorTestEnabled == true) {
    local_38 = state;
    fVar8 = ceilf((float)targetWidth * 0.7);
    iVar7 = (int)fVar8;
    local_40 = targetHeight;
    fVar8 = ceilf((float)targetHeight * 0.7);
    iVar5 = (int)fVar8;
    local_48 = deRandom_getUint32(&rnd->m_rnd);
    iVar1 = local_40;
    if (targetWidth != 0x7fffffeb || iVar7 != -0x80000000) {
      local_48 = local_48 % ((targetWidth - iVar7) + 0x15U) + iVar7;
    }
    local_44 = iVar5 + -0x80000000;
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    if (iVar1 != 0x7fffffeb || local_44 != 0) {
      dVar2 = dVar2 % ((iVar1 - iVar5) + 0x15U) + iVar5;
    }
    dVar3 = deRandom_getUint32(&rnd->m_rnd);
    iVar5 = targetWidth - local_48;
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    (local_38->scissorRectangle).left = dVar3 % (iVar5 + 0x15U) - 10;
    (local_38->scissorRectangle).bottom = dVar4 % ((iVar1 - dVar2) + 0x15) - 10;
    (local_38->scissorRectangle).width = local_48;
    (local_38->scissorRectangle).height = dVar2;
    state = local_38;
  }
  if (state->stencilTestEnabled == true) {
    lVar6 = 0;
    do {
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::compareFuncs,computeRandomRenderState::stencilOps,
                 &local_58,1);
      *(uint *)((long)&state->stencil[0].function + lVar6) = local_58;
      dVar2 = deRandom_getUint32(&rnd->m_rnd);
      *(deUint32 *)((long)&state->stencil[0].reference + lVar6) =
           (dVar2 - ((dVar2 / 0x108) * 0x100 + (dVar2 / 0x108) * 8)) + -3;
      dVar2 = deRandom_getUint32(&rnd->m_rnd);
      *(deUint32 *)((long)&state->stencil[0].compareMask + lVar6) = dVar2;
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::stencilOps,computeRandomRenderState::blendEquations,
                 &local_58,1);
      *(uint *)((long)&state->stencil[0].stencilFailOp + lVar6) = local_58;
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::stencilOps,computeRandomRenderState::blendEquations,
                 &local_58,1);
      *(uint *)((long)&state->stencil[0].depthFailOp + lVar6) = local_58;
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::stencilOps,computeRandomRenderState::blendEquations,
                 &local_58,1);
      *(uint *)((long)&state->stencil[0].depthPassOp + lVar6) = local_58;
      dVar2 = deRandom_getUint32(&rnd->m_rnd);
      *(deUint32 *)((long)&state->stencil[0].writeMask + lVar6) = dVar2;
      lVar6 = lVar6 + 0x1c;
    } while (lVar6 == 0x1c);
  }
  if (state->depthTestEnabled == true) {
    local_58 = 0;
    de::Random::choose<unsigned_int_const*,unsigned_int*>
              (rnd,computeRandomRenderState::compareFuncs,computeRandomRenderState::stencilOps,
               &local_58,1);
    state->depthFunc = local_58;
    fVar8 = deRandom_getFloat(&rnd->m_rnd);
    state->depthWriteMask = fVar8 < 0.7;
  }
  if (state->blendEnabled == true) {
    if (local_3c == 2) {
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquationsES2,(uint *)&DAT_01cfe308,&local_58,1);
      (state->blendRGBState).equation = local_58;
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncs,
                 computeRandomRenderState::blendEquationsES2,&local_58,1);
      (state->blendRGBState).srcFunc = local_58;
      local_58 = 0;
      first = computeRandomRenderState::blendFuncsDstES2;
      last = (deUint32 *)&DAT_01cfe348;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncsDstES2,(uint *)&DAT_01cfe348,&local_58,1);
      (state->blendRGBState).dstFunc = local_58;
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquationsES2,(uint *)&DAT_01cfe308,&local_58,1);
      (state->blendAState).equation = local_58;
    }
    else {
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquations,(uint *)&DAT_01cfe2b4,&local_58,1);
      (state->blendRGBState).equation = local_58;
      local_58 = 0;
      first = computeRandomRenderState::blendFuncs;
      last = computeRandomRenderState::blendEquationsES2;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncs,
                 computeRandomRenderState::blendEquationsES2,&local_58,1);
      (state->blendRGBState).srcFunc = local_58;
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncs,
                 computeRandomRenderState::blendEquationsES2,&local_58,1);
      (state->blendRGBState).dstFunc = local_58;
      local_58 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquations,(uint *)&DAT_01cfe2b4,&local_58,1);
      (state->blendAState).equation = local_58;
    }
    local_58 = 0;
    de::Random::choose<unsigned_int_const*,unsigned_int*>
              (rnd,computeRandomRenderState::blendFuncs,computeRandomRenderState::blendEquationsES2,
               &local_58,1);
    (state->blendAState).srcFunc = local_58;
    local_58 = 0;
    de::Random::choose<unsigned_int_const*,unsigned_int*>(rnd,first,last,&local_58,1);
    (state->blendAState).dstFunc = local_58;
    getRandomColor((InteractionTestUtil *)&local_58,rnd);
    *(ulong *)(state->blendColor).m_data = CONCAT44(uStack_54,local_58);
    *(undefined8 *)((state->blendColor).m_data + 2) = uStack_50;
  }
  lVar6 = 0;
  do {
    fVar8 = deRandom_getFloat(&rnd->m_rnd);
    (state->colorMask).m_data[lVar6] = fVar8 < 0.7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  return;
}

Assistant:

void computeRandomRenderState (de::Random& rnd, RenderState& state, glu::ApiType apiType, int targetWidth, int targetHeight)
{
	// Constants governing randomization.
	const float		scissorTestProbability		= 0.2f;
	const float		stencilTestProbability		= 0.4f;
	const float		depthTestProbability		= 0.6f;
	const float		blendProbability			= 0.4f;
	const float		ditherProbability			= 0.5f;

	const float		depthWriteProbability		= 0.7f;
	const float		colorWriteProbability		= 0.7f;

	const int		minStencilVal				= -3;
	const int		maxStencilVal				= 260;

	const int		maxScissorOutOfBounds		= 10;
	const float		minScissorSize				= 0.7f;

	static const deUint32 compareFuncs[] =
	{
		GL_NEVER,
		GL_ALWAYS,
		GL_LESS,
		GL_LEQUAL,
		GL_EQUAL,
		GL_GEQUAL,
		GL_GREATER,
		GL_NOTEQUAL
	};

	static const deUint32 stencilOps[] =
	{
		GL_KEEP,
		GL_ZERO,
		GL_REPLACE,
		GL_INCR,
		GL_DECR,
		GL_INVERT,
		GL_INCR_WRAP,
		GL_DECR_WRAP
	};

	static const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	static const deUint32 blendFuncs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	static const deUint32 blendEquationsES2[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT
	};

	static const deUint32 blendFuncsDstES2[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA
	};

	state.scissorTestEnabled	= rnd.getFloat() < scissorTestProbability;
	state.stencilTestEnabled	= rnd.getFloat() < stencilTestProbability;
	state.depthTestEnabled		= rnd.getFloat() < depthTestProbability;
	state.blendEnabled			= rnd.getFloat() < blendProbability;
	state.ditherEnabled			= rnd.getFloat() < ditherProbability;

	if (state.scissorTestEnabled)
	{
		int minScissorW		= deCeilFloatToInt32(minScissorSize * (float)targetWidth);
		int minScissorH		= deCeilFloatToInt32(minScissorSize * (float)targetHeight);
		int maxScissorW		= targetWidth + 2*maxScissorOutOfBounds;
		int maxScissorH		= targetHeight + 2*maxScissorOutOfBounds;

		int scissorW		= rnd.getInt(minScissorW, maxScissorW);
		int	scissorH		= rnd.getInt(minScissorH, maxScissorH);
		int scissorX		= rnd.getInt(-maxScissorOutOfBounds, targetWidth+maxScissorOutOfBounds-scissorW);
		int scissorY		= rnd.getInt(-maxScissorOutOfBounds, targetHeight+maxScissorOutOfBounds-scissorH);

		state.scissorRectangle = rr::WindowRectangle(scissorX, scissorY, scissorW, scissorH);
	}

	if (state.stencilTestEnabled)
	{
		for (int ndx = 0; ndx < 2; ndx++)
		{
			state.stencil[ndx].function			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
			state.stencil[ndx].reference		= rnd.getInt(minStencilVal, maxStencilVal);
			state.stencil[ndx].compareMask		= rnd.getUint32();
			state.stencil[ndx].stencilFailOp	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthFailOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthPassOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].writeMask		= rnd.getUint32();
		}
	}

	if (state.depthTestEnabled)
	{
		state.depthFunc			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
		state.depthWriteMask	= rnd.getFloat() < depthWriteProbability;
	}

	if (state.blendEnabled)
	{
		if (apiType == glu::ApiType::es(2,0))
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));
		}
		else
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
		}

		state.blendColor				= getRandomColor(rnd);
	}

	for (int ndx = 0; ndx < 4; ndx++)
		state.colorMask[ndx] = rnd.getFloat() < colorWriteProbability;
}